

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Testrunner.cpp
# Opt level: O3

void runSingleTest(Setup *s,u16 op)

{
  Setup *s_00;
  Result mur;
  Result mor;
  undefined1 local_450 [380];
  int local_2d4;
  long local_248;
  long lStack_240;
  Result local_238;
  
  opcode = op;
  setupTestInstruction(s,0x1000,op);
  Sandbox::prepare(&sandbox,op);
  resetMusashi(s);
  resetMoira(s);
  memcpy(&mi,moiraMem,0x10000);
  mi.len = 0x10000;
  di.stream = (FILE *)(local_450 + 0xfc);
  local_450[0xfc] = '\0';
  local_2d4 = print_insn_m68k(0x1000,&di);
  s_00 = s;
  runMusashi(s,(Result *)local_450);
  muclk[0] = local_248 + muclk[0];
  muclk[1] = lStack_240 + muclk[1];
  runMoira(s_00,&local_238);
  moclk[0] = local_238.elapsed[0] + moclk[0];
  moclk[1] = local_238.elapsed[1] + moclk[1];
  compare(s,(Result *)local_450,&local_238);
  return;
}

Assistant:

void runSingleTest(Setup &s, u16 op)
{
    Result mur, mor;

    opcode = op;

    // Prepare the test case with the selected instruction
    setupTestInstruction(s, pc, op);

    // Reset the sandbox (memory accesses observer)
    sandbox.prepare(op);

    // Prepare
    resetMusashi(s);
    resetMoira(s);

    // Run the binutils disassembler
    runBinutils(s, mur);

    // Run Musashi
    runMusashi(s, mur);
    muclk[0] += mur.elapsed[0];
    muclk[1] += mur.elapsed[1];

    // Run Moira
    runMoira(s, mor);
    moclk[0] += mor.elapsed[0];
    moclk[1] += mor.elapsed[1];

    // Compare
    compare(s, mur, mor);
}